

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscTests.cpp
# Opt level: O2

void __thiscall agge::tests::MiscTests::PointsSubtractionProducesVector(MiscTests *this)

{
  allocator local_61;
  agge_vector<float> local_60;
  agge_vector<float> local_58;
  string local_50;
  LocationInfo local_30;
  
  local_58.dx = -72.402;
  local_58.dy = 323.29;
  local_60.dx = -72.402;
  local_60.dy = 323.29;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x85);
  ut::are_equal<agge::agge_vector<float>,agge::agge_vector<float>>(&local_58,&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_58.dx = 71.0;
  local_58.dy = -11.49;
  local_60.dx = 71.0;
  local_60.dy = -11.490001;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x86);
  ut::are_equal<agge::agge_vector<float>,agge::agge_vector<float>>(&local_58,&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_58.dx = 1.402;
  local_58.dy = -311.8;
  local_60.dx = 1.4020001;
  local_60.dy = -311.8;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x87);
  ut::are_equal<agge::agge_vector<float>,agge::agge_vector<float>>(&local_58,&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_58.dx = -NAN;
  local_58.dy = -NAN;
  local_60.dx = -NAN;
  local_60.dy = -NAN;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x89);
  ut::are_equal<agge::agge_vector<int>,agge::agge_vector<int>>
            ((agge_vector<int> *)&local_58,(agge_vector<int> *)&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_58.dx = 1.27658e-42;
  local_58.dy = 2.77177e-42;
  local_60.dx = 1.27658e-42;
  local_60.dy = 2.77177e-42;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x8a);
  ut::are_equal<agge::agge_vector<int>,agge::agge_vector<int>>
            ((agge_vector<int> *)&local_58,(agge_vector<int> *)&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_58.dx = 1.26117e-44;
  local_58.dy = -NAN;
  local_60.dx = 1.26117e-44;
  local_60.dy = -NAN;
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/MiscTests.cpp"
             ,&local_61);
  ut::LocationInfo::LocationInfo(&local_30,&local_50,0x8b);
  ut::are_equal<agge::agge_vector<int>,agge::agge_vector<int>>
            ((agge_vector<int> *)&local_58,(agge_vector<int> *)&local_60,&local_30);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( PointsSubtractionProducesVector )
			{
				// INIT
				const point_r p1 = { -1.202f, 311.9f }, p2 = { 71.2f, -11.39f }, p3 = { 0.2f, 0.1f };
				const point<int> p4 = { -9, 13 }, p5 = { 911, 1978 }, p6 = { 0, 0 };

				// ACT / ASSERT
				assert_equal(create_vector(-72.402f, 323.29f), p1 - p2);
				assert_equal(create_vector(71.0f, -11.49f), p2 - p3);
				assert_equal(create_vector(1.402f, -311.8f), p3 - p1);

				assert_equal(create_vector(-920, -1965), p4 - p5);
				assert_equal(create_vector(911, 1978), p5 - p6);
				assert_equal(create_vector(9, -13), p6 - p4);
			}